

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3_aggregate_context(sqlite3_context *p,int nByte)

{
  Mem *pMem;
  
  if ((p->pMem->flags & 0x2000) != 0) {
    return p->pMem->z;
  }
  pMem = p->pMem;
  if (nByte < 1) {
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = (char *)0x0;
  }
  else {
    sqlite3VdbeMemClearAndResize(pMem,nByte);
    pMem->flags = 0x2000;
    pMem->u = (MemValue)p->pFunc;
    if (pMem->z != (char *)0x0) {
      memset(pMem->z,0,(ulong)(uint)nByte);
      return pMem->z;
    }
  }
  return (void *)0x0;
}

Assistant:

SQLITE_API void *sqlite3_aggregate_context(sqlite3_context *p, int nByte){
  assert( p && p->pFunc && p->pFunc->xFinalize );
  assert( sqlite3_mutex_held(p->pOut->db->mutex) );
  testcase( nByte<0 );
  if( (p->pMem->flags & MEM_Agg)==0 ){
    return createAggContext(p, nByte);
  }else{
    return (void*)p->pMem->z;
  }
}